

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O1

void __thiscall
TPZFMatrix<std::complex<float>_>::TPZFMatrix
          (TPZFMatrix<std::complex<float>_> *this,int64_t rows,int64_t cols,complex<float> *val)

{
  complex<float> *__s;
  long lVar1;
  ulong uVar2;
  
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow = rows;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol = cols;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_018459c8;
  this->fElem = (complex<float> *)0x0;
  this->fGiven = (complex<float> *)0x0;
  this->fSize = 0;
  TPZVec<int>::TPZVec(&(this->fPivot).super_TPZVec<int>,0);
  (this->fPivot).super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  (this->fPivot).super_TPZVec<int>.fStore = (this->fPivot).fExtAlloc;
  (this->fPivot).super_TPZVec<int>.fNElements = 0;
  (this->fPivot).super_TPZVec<int>.fNAlloc = 0;
  (this->fWork)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01842418;
  (this->fWork).fStore = (complex<float> *)0x0;
  (this->fWork).fNElements = 0;
  (this->fWork).fNAlloc = 0;
  uVar2 = cols * rows;
  if (uVar2 != 0) {
    __s = (complex<float> *)operator_new__(-(ulong)(uVar2 >> 0x3d != 0) | uVar2 * 8);
    memset(__s,0,uVar2 * 8);
    this->fElem = __s;
    if (0 < (long)uVar2) {
      lVar1 = 0;
      do {
        this->fElem[lVar1]._M_value = val->_M_value;
        lVar1 = lVar1 + 1;
      } while (uVar2 - lVar1 != 0);
    }
  }
  return;
}

Assistant:

inline TPZFMatrix<TVar>::TPZFMatrix(const int64_t rows,const int64_t cols,const TVar & val )
: TPZRegisterClassId(&TPZFMatrix<TVar>::ClassId), TPZMatrix<TVar>( rows, cols ), 
 fElem(0), fGiven(0), fSize(0) {
    int64_t size = rows * cols;
    if(!size) return;
    fElem=new TVar[size];
#ifdef PZDEBUG
    if ( fElem == NULL && size) Error( "Constructor <memory allocation error>." );
#endif
    for(int64_t i=0;i<size;i++) fElem[i] = val;
}